

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIRResampler.cpp
# Opt level: O3

void __thiscall
SRCTools::FIRResampler::getOutSamplesStereo(FIRResampler *this,FloatSample **outSamples)

{
  double __x;
  FloatSample aFVar1 [2];
  FIRCoefficient *pFVar2;
  FloatSample *pFVar3;
  double dVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  uVar8 = this->ringBufferPosition;
  __x = this->phase;
  if ((this->constants).usePhaseInterpolation == true) {
    dVar4 = floor(__x);
    uVar5 = (this->constants).numberOfTaps - (uint)(__x - dVar4 != 0.0);
    uVar7 = (ulong)__x;
    fVar9 = 0.0;
    fVar10 = 0.0;
    if ((uint)uVar7 < uVar5) {
      pFVar2 = (this->constants).taps;
      do {
        fVar11 = pFVar2[uVar7 & 0xffffffff];
        fVar11 = (float)((double)(pFVar2[(int)uVar7 + 1] - fVar11) * (__x - dVar4) + (double)fVar11)
        ;
        aFVar1 = (this->constants).ringBuffer[uVar8];
        fVar9 = fVar9 + fVar11 * aFVar1[0];
        fVar10 = fVar10 + fVar11 * aFVar1[1];
        uVar8 = uVar8 + 1 & (this->constants).delayLineMask;
        uVar6 = (int)uVar7 + (this->constants).numberOfPhases;
        uVar7 = (ulong)uVar6;
      } while (uVar6 < uVar5);
    }
  }
  else {
    uVar7 = (ulong)__x;
    uVar5 = (this->constants).numberOfTaps;
    fVar9 = 0.0;
    fVar10 = 0.0;
    if ((uint)uVar7 < uVar5) {
      do {
        aFVar1 = (this->constants).ringBuffer[uVar8];
        fVar11 = (this->constants).taps[uVar7 & 0xffffffff];
        fVar9 = fVar9 + fVar11 * aFVar1[0];
        fVar10 = fVar10 + fVar11 * aFVar1[1];
        uVar8 = uVar8 + 1 & (this->constants).delayLineMask;
        uVar6 = (int)uVar7 + (this->constants).numberOfPhases;
        uVar7 = (ulong)uVar6;
      } while (uVar6 < uVar5);
    }
  }
  pFVar3 = *outSamples;
  *outSamples = pFVar3 + 2;
  *(ulong *)pFVar3 = CONCAT44(fVar10,fVar9);
  this->phase = __x + (this->constants).phaseIncrement;
  return;
}

Assistant:

void FIRResampler::getOutSamplesStereo(FloatSample *&outSamples) {
	FloatSample leftSample = 0.0;
	FloatSample rightSample = 0.0;
	unsigned int delaySampleIx = ringBufferPosition;
	if (constants.usePhaseInterpolation) {
		double phaseFraction = phase - floor(phase);
		unsigned int maxTapIx = phaseFraction == 0 ? constants.numberOfTaps : constants.numberOfTaps - 1;
		for (unsigned int tapIx = static_cast<unsigned int>(phase); tapIx < maxTapIx; tapIx += constants.numberOfPhases) {
			FIRCoefficient tap = FIRCoefficient(constants.taps[tapIx] + (constants.taps[tapIx + 1] - constants.taps[tapIx]) * phaseFraction);
			leftSample += tap * constants.ringBuffer[delaySampleIx][0];
			rightSample += tap * constants.ringBuffer[delaySampleIx][1];
			delaySampleIx = (delaySampleIx + 1) & constants.delayLineMask;
		}
	} else {
		// Optimised for rational resampling ratios when phase is always integer
		for (unsigned int tapIx = static_cast<unsigned int>(phase); tapIx < constants.numberOfTaps; tapIx += constants.numberOfPhases) {
			FIRCoefficient tap = constants.taps[tapIx];
			leftSample += tap * constants.ringBuffer[delaySampleIx][0];
			rightSample += tap * constants.ringBuffer[delaySampleIx][1];
			delaySampleIx = (delaySampleIx + 1) & constants.delayLineMask;
		}
	}
	*(outSamples++) = leftSample;
	*(outSamples++) = rightSample;
	phase += constants.phaseIncrement;
}